

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<wchar_t> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  uint uVar1;
  wchar_t wVar2;
  Alignment AVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CharPtr pwVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  wchar_t __tmp;
  uint uVar20;
  size_t size;
  int iVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  AlignSpec subspec;
  AlignSpec local_44;
  long local_38;
  
  uVar1 = (spec->super_WidthSpec).width_;
  uVar12 = (ulong)uVar1;
  wVar2 = (spec->super_WidthSpec).fill_;
  AVar3 = spec->align_;
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar10 = prefix_size - 1;
    local_44.super_WidthSpec.fill_ = L'0';
    local_44.align_ = ALIGN_NUMERIC;
    local_44.super_WidthSpec.width_ = uVar10;
    if (uVar1 <= uVar10) {
      pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
      return pwVar8;
    }
    puVar4 = *(undefined8 **)(this + 8);
    if ((ulong)puVar4[3] < uVar12) {
      (**(code **)*puVar4)(puVar4,uVar12);
    }
    uVar20 = uVar1 - uVar10;
    if (AVar3 != ALIGN_LEFT) {
      puVar4 = *(undefined8 **)(this + 8);
      lVar17 = puVar4[2];
      uVar12 = lVar17 + (ulong)uVar20;
      if ((ulong)puVar4[3] < uVar12) {
        local_38 = lVar17;
        (**(code **)*puVar4)(puVar4,uVar12);
        lVar17 = local_38;
      }
      puVar4[2] = uVar12;
      auVar7 = _DAT_00148890;
      auVar6 = _DAT_00144c30;
      auVar5 = _DAT_00144c20;
      if (uVar1 != uVar10) {
        uVar15 = (ulong)uVar20 + 0x3fffffffffffffff;
        uVar12 = uVar15 & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar12;
        auVar23._0_8_ = uVar12;
        auVar23._12_4_ = (int)(uVar12 >> 0x20);
        lVar17 = *(long *)(*(long *)(this + 8) + 8) + lVar17 * 4;
        lVar13 = 0;
        auVar23 = auVar23 ^ _DAT_00144c30;
        do {
          auVar31._8_4_ = (int)lVar13;
          auVar31._0_8_ = lVar13;
          auVar31._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar36 = (auVar31 | auVar5) ^ auVar6;
          iVar29 = auVar23._4_4_;
          if ((bool)(~(auVar36._4_4_ == iVar29 && auVar23._0_4_ < auVar36._0_4_ ||
                      iVar29 < auVar36._4_4_) & 1)) {
            *(wchar_t *)(lVar17 + lVar13 * 4) = wVar2;
          }
          if ((auVar36._12_4_ != auVar23._12_4_ || auVar36._8_4_ <= auVar23._8_4_) &&
              auVar36._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar17 + 4 + lVar13 * 4) = wVar2;
          }
          auVar31 = (auVar31 | auVar7) ^ auVar6;
          iVar37 = auVar31._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar31._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar17 + 8 + lVar13 * 4) = wVar2;
            *(wchar_t *)(lVar17 + 0xc + lVar13 * 4) = wVar2;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar12 - ((uint)uVar15 & 3)) + 4 != lVar13);
      }
    }
    pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_44,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pwVar8;
    }
    puVar4 = *(undefined8 **)(this + 8);
    lVar17 = puVar4[2];
    uVar12 = lVar17 + (ulong)uVar20;
    if ((ulong)puVar4[3] < uVar12) {
      (**(code **)*puVar4)(puVar4,uVar12);
    }
    puVar4[2] = uVar12;
    auVar7 = _DAT_00148890;
    auVar6 = _DAT_00144c30;
    auVar5 = _DAT_00144c20;
    if (uVar1 == uVar10) {
      return pwVar8;
    }
    uVar15 = (ulong)uVar20 + 0x3fffffffffffffff;
    uVar12 = uVar15 & 0x3fffffffffffffff;
    auVar36._8_4_ = (int)uVar12;
    auVar36._0_8_ = uVar12;
    auVar36._12_4_ = (int)(uVar12 >> 0x20);
    lVar17 = *(long *)(*(long *)(this + 8) + 8) + lVar17 * 4;
    lVar13 = 0;
    auVar36 = auVar36 ^ _DAT_00144c30;
    do {
      auVar32._8_4_ = (int)lVar13;
      auVar32._0_8_ = lVar13;
      auVar32._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar23 = (auVar32 | auVar5) ^ auVar6;
      iVar29 = auVar36._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar29 && auVar36._0_4_ < auVar23._0_4_ ||
                  iVar29 < auVar23._4_4_) & 1)) {
        *(wchar_t *)(lVar17 + lVar13 * 4) = wVar2;
      }
      if ((auVar23._12_4_ != auVar36._12_4_ || auVar23._8_4_ <= auVar36._8_4_) &&
          auVar23._12_4_ <= auVar36._12_4_) {
        *(wchar_t *)(lVar17 + 4 + lVar13 * 4) = wVar2;
      }
      auVar23 = (auVar32 | auVar7) ^ auVar6;
      iVar37 = auVar23._4_4_;
      if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar36._0_4_)) {
        *(wchar_t *)(lVar17 + 8 + lVar13 * 4) = wVar2;
        *(wchar_t *)(lVar17 + 0xc + lVar13 * 4) = wVar2;
      }
      lVar13 = lVar13 + 4;
    } while ((uVar12 - ((uint)uVar15 & 3)) + 4 != lVar13);
    return pwVar8;
  }
  uVar10 = prefix_size + num_digits;
  puVar4 = *(undefined8 **)(this + 8);
  lVar17 = puVar4[2];
  if (uVar1 <= uVar10) {
    uVar12 = lVar17 + (ulong)uVar10;
    if ((ulong)puVar4[3] < uVar12) {
      (**(code **)*puVar4)(puVar4,uVar12);
    }
    puVar4[2] = uVar12;
    lVar17 = lVar17 * 4 + *(long *)(*(long *)(this + 8) + 8);
    if (prefix_size != 0) {
      lVar13 = (ulong)prefix_size + 1;
      lVar11 = 0;
      do {
        *(int *)(lVar17 + lVar11 * 4) = (int)prefix[lVar11];
        lVar13 = lVar13 + -1;
        lVar11 = lVar11 + 1;
      } while (1 < lVar13);
    }
    piVar9 = (int *)(lVar17 + (ulong)uVar10 * 4);
    goto LAB_0013f4e9;
  }
  uVar15 = lVar17 + uVar12;
  if ((ulong)puVar4[3] < uVar15) {
    (**(code **)*puVar4)(puVar4);
  }
  puVar4[2] = uVar15;
  auVar7 = _DAT_00148890;
  auVar6 = _DAT_00144c30;
  auVar5 = _DAT_00144c20;
  lVar13 = *(long *)(*(long *)(this + 8) + 8);
  piVar19 = (int *)(lVar13 + lVar17 * 4);
  piVar9 = piVar19 + uVar12;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      lVar17 = (ulong)prefix_size + 1;
      do {
        *piVar19 = (int)*prefix;
        prefix = prefix + 1;
        piVar19 = piVar19 + 1;
        lVar17 = lVar17 + -1;
        uVar10 = num_digits;
      } while (1 < lVar17);
    }
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar15 = (ulong)uVar10;
      uVar14 = uVar12 - uVar15 >> 1;
      if (1 < uVar12 - uVar15) {
        uVar18 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar18;
        auVar24._0_8_ = uVar18;
        auVar24._12_4_ = (int)(uVar18 >> 0x20);
        lVar11 = lVar13 + lVar17 * 4;
        lVar16 = 0;
        auVar24 = auVar24 ^ _DAT_00144c30;
        do {
          auVar33._8_4_ = (int)lVar16;
          auVar33._0_8_ = lVar16;
          auVar33._12_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar23 = (auVar33 | auVar5) ^ auVar6;
          iVar29 = auVar24._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar24._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar11 + lVar16 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
              auVar23._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar11 + 4 + lVar16 * 4) = wVar2;
          }
          auVar23 = (auVar33 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar11 + 8 + lVar16 * 4) = wVar2;
            *(wchar_t *)(lVar11 + 0xc + lVar16 * 4) = wVar2;
          }
          lVar16 = lVar16 + 4;
        } while ((uVar18 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar16);
      }
      auVar7 = _DAT_00148890;
      auVar6 = _DAT_00144c30;
      auVar5 = _DAT_00144c20;
      if (uVar1 != uVar10) {
        uVar12 = (uVar12 * 4 + (uVar14 + uVar15) * -4) - 4;
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        auVar26._0_8_ = uVar12 >> 2;
        auVar26._8_8_ = auVar25._8_8_ >> 2;
        lVar13 = lVar13 + uVar14 * 4 + lVar17 * 4 + uVar15 * 4;
        uVar18 = 0;
        auVar26 = auVar26 ^ _DAT_00144c30;
        do {
          auVar34._8_4_ = (int)uVar18;
          auVar34._0_8_ = uVar18;
          auVar34._12_4_ = (int)(uVar18 >> 0x20);
          auVar23 = (auVar34 | auVar5) ^ auVar6;
          iVar29 = auVar26._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar26._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + uVar18 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar26._12_4_ || auVar23._8_4_ <= auVar26._8_4_) &&
              auVar23._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar13 + 4 + uVar18 * 4) = wVar2;
          }
          auVar23 = (auVar34 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + uVar18 * 4) = wVar2;
            *(wchar_t *)(lVar13 + 0xc + uVar18 * 4) = wVar2;
          }
          uVar18 = uVar18 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar18);
      }
      if (prefix_size != 0) {
        lVar17 = (ulong)prefix_size + 1;
        lVar13 = 0;
        do {
          piVar19[uVar14 + lVar13] = (int)prefix[lVar13];
          lVar17 = lVar17 + -1;
          lVar13 = lVar13 + 1;
        } while (1 < lVar17);
      }
      piVar9 = piVar19 + uVar14 + uVar15;
      goto LAB_0013f4e9;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        lVar11 = (ulong)prefix_size + 1;
        lVar16 = 0;
        do {
          piVar19[lVar16] = (int)prefix[lVar16];
          lVar11 = lVar11 + -1;
          lVar16 = lVar16 + 1;
        } while (1 < lVar11);
      }
      auVar7 = _DAT_00148890;
      auVar6 = _DAT_00144c30;
      auVar5 = _DAT_00144c20;
      uVar15 = (ulong)uVar10;
      piVar9 = piVar19 + uVar15;
      if (uVar10 != uVar1) {
        uVar14 = (uVar12 * 4 + uVar15 * -4) - 4;
        auVar21._8_4_ = (int)uVar14;
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = (int)(uVar14 >> 0x20);
        auVar22._0_8_ = uVar14 >> 2;
        auVar22._8_8_ = auVar21._8_8_ >> 2;
        lVar13 = lVar13 + uVar15 * 4 + lVar17 * 4;
        uVar12 = 0;
        auVar22 = auVar22 ^ _DAT_00144c30;
        do {
          auVar30._8_4_ = (int)uVar12;
          auVar30._0_8_ = uVar12;
          auVar30._12_4_ = (int)(uVar12 >> 0x20);
          auVar23 = (auVar30 | auVar5) ^ auVar6;
          iVar29 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + uVar12 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            *(wchar_t *)(lVar13 + 4 + uVar12 * 4) = wVar2;
          }
          auVar23 = (auVar30 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar22._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + uVar12 * 4) = wVar2;
            *(wchar_t *)(lVar13 + 0xc + uVar12 * 4) = wVar2;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      goto LAB_0013f4e9;
    }
    if (prefix_size != 0) {
      lVar11 = (ulong)prefix_size + 1;
      lVar17 = 0;
      do {
        piVar9[lVar17 - (ulong)uVar10] = (int)prefix[lVar17];
        lVar11 = lVar11 + -1;
        lVar17 = lVar17 + 1;
      } while (1 < lVar11);
    }
  }
  auVar7 = _DAT_00148890;
  auVar6 = _DAT_00144c30;
  auVar5 = _DAT_00144c20;
  if (piVar19 != piVar9 + -(ulong)uVar10) {
    uVar12 = ((lVar13 + uVar15 * 4) - (long)(piVar19 + uVar10)) - 4;
    auVar27._8_4_ = (int)uVar12;
    auVar27._0_8_ = uVar12;
    auVar27._12_4_ = (int)(uVar12 >> 0x20);
    auVar28._0_8_ = uVar12 >> 2;
    auVar28._8_8_ = auVar27._8_8_ >> 2;
    uVar15 = 0;
    auVar28 = auVar28 ^ _DAT_00144c30;
    do {
      auVar35._8_4_ = (int)uVar15;
      auVar35._0_8_ = uVar15;
      auVar35._12_4_ = (int)(uVar15 >> 0x20);
      auVar23 = (auVar35 | auVar5) ^ auVar6;
      iVar29 = auVar28._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar29 && auVar28._0_4_ < auVar23._0_4_ ||
                  iVar29 < auVar23._4_4_) & 1)) {
        piVar19[uVar15] = wVar2;
      }
      if ((auVar23._12_4_ != auVar28._12_4_ || auVar23._8_4_ <= auVar28._8_4_) &&
          auVar23._12_4_ <= auVar28._12_4_) {
        piVar19[uVar15 + 1] = wVar2;
      }
      auVar23 = (auVar35 | auVar7) ^ auVar6;
      iVar37 = auVar23._4_4_;
      if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar28._0_4_)) {
        piVar19[uVar15 + 2] = wVar2;
        piVar19[uVar15 + 3] = wVar2;
      }
      uVar15 = uVar15 + 4;
    } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar15);
  }
LAB_0013f4e9:
  return piVar9 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}